

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster.h
# Opt level: O1

void brotli::HistogramCombine<brotli::Histogram<704>>
               (Histogram<704> *out,uint32_t *cluster_size,uint32_t *symbols,size_t symbols_size,
               size_t max_clusters)

{
  undefined8 *puVar1;
  pointer pHVar2;
  double *pdVar3;
  double dVar4;
  uint idx1;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined8 uVar8;
  pointer puVar9;
  size_t sVar10;
  ulong uVar11;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var12;
  size_t sVar13;
  pointer puVar14;
  size_t __n;
  size_type __new_size;
  uint uVar15;
  size_t i;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  bool bVar20;
  vector<unsigned_int,_std::allocator<unsigned_int>_> clusters;
  vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_> pairs;
  HistogramPair front;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a0;
  vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_> local_88;
  ulong local_70;
  double local_68;
  size_t local_60;
  size_t local_58;
  uint32_t *local_50;
  undefined8 local_48;
  double dStack_40;
  double local_38;
  
  local_60 = max_clusters;
  local_50 = symbols;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int*,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_a0,symbols,
             symbols + symbols_size,(allocator_type *)&local_88);
  puVar9 = local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar14 = local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar11 = (long)local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    lVar16 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar16 == 0; lVar16 = lVar16 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar16 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar14,puVar9);
  }
  _Var12 = std::
           __unique<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                     (local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
  local_58 = symbols_size;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&local_a0,
             (long)_Var12._M_current -
             (long)local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  local_88.super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar11 = 0;
    do {
      uVar18 = uVar11 + 1;
      uVar17 = uVar18;
      if (uVar18 < (ulong)((long)local_a0.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_a0.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 2)) {
        do {
          CompareAndPushToQueue<brotli::Histogram<704>>
                    (out,cluster_size,
                     local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar11],
                     local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar17],&local_88);
          uVar17 = uVar17 + 1;
        } while (uVar17 < (ulong)((long)local_a0.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_a0.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 2));
      }
      uVar11 = uVar18;
    } while (uVar18 < (ulong)((long)local_a0.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_a0.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  sVar10 = local_58;
  if (4 < (ulong)((long)local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start)) {
    local_70 = 1;
    local_68 = 0.0;
    do {
      while (local_68 <=
             (local_88.
              super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>.
              _M_impl.super__Vector_impl_data._M_start)->cost_diff) {
        local_68 = 1e+99;
        local_70 = local_60;
        if ((ulong)((long)local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 2) <= local_60)
        goto LAB_00175af3;
      }
      idx1 = (local_88.
              super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>.
              _M_impl.super__Vector_impl_data._M_start)->idx1;
      uVar5 = (local_88.
               super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>.
               _M_impl.super__Vector_impl_data._M_start)->idx2;
      out[idx1].total_count_ = out[idx1].total_count_ + out[uVar5].total_count_;
      lVar16 = 0;
      do {
        out[idx1].data_[lVar16] = out[idx1].data_[lVar16] + out[uVar5].data_[lVar16];
        lVar16 = lVar16 + 1;
      } while (lVar16 != 0x2c0);
      out[idx1].bit_cost_ =
           (local_88.
            super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>.
            _M_impl.super__Vector_impl_data._M_start)->cost_combo;
      cluster_size[idx1] = cluster_size[idx1] + cluster_size[uVar5];
      if (sVar10 != 0) {
        sVar13 = 0;
        do {
          if (local_50[sVar13] == uVar5) {
            local_50[sVar13] = idx1;
          }
          sVar13 = sVar13 + 1;
        } while (sVar10 != sVar13);
      }
      if (local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        __n = (long)local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_finish -
              (long)local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start;
        puVar14 = local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          __n = __n - 4;
          if (uVar5 <= *puVar14) {
            if (puVar14 + 1 !=
                local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              memmove(puVar14,puVar14 + 1,__n);
            }
            local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1;
            break;
          }
          puVar14 = puVar14 + 1;
        } while (puVar14 !=
                 local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      if (local_88.super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_88.super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        __new_size = 0;
      }
      else {
        lVar16 = 0;
        uVar11 = 0;
        __new_size = 0;
        do {
          uVar6 = *(uint *)((long)&(local_88.
                                    super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->idx1 + lVar16);
          if ((((uVar6 != idx1) &&
               (uVar7 = *(uint *)((long)&(local_88.
                                          super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->idx2 + lVar16)
               , uVar7 != uVar5)) && (uVar6 != uVar5)) && (uVar7 != idx1)) {
            dVar4 = (local_88.
                     super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                     ._M_impl.super__Vector_impl_data._M_start)->cost_diff;
            pdVar3 = (double *)
                     ((long)&(local_88.
                              super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                              ._M_impl.super__Vector_impl_data._M_start)->cost_diff + lVar16);
            bVar20 = dVar4 == *pdVar3;
            bVar19 = dVar4 < *pdVar3;
            if ((bVar20) && (!NAN(dVar4) && !NAN(*pdVar3))) {
              uVar15 = (local_88.
                        super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                        ._M_impl.super__Vector_impl_data._M_start)->idx2 -
                       (local_88.
                        super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                        ._M_impl.super__Vector_impl_data._M_start)->idx1;
              bVar19 = uVar15 < uVar7 - uVar6;
              bVar20 = uVar15 == uVar7 - uVar6;
            }
            puVar1 = (undefined8 *)
                     ((long)&(local_88.
                              super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                              ._M_impl.super__Vector_impl_data._M_start)->idx1 + lVar16);
            if (bVar19 || bVar20) {
              local_88.
              super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>.
              _M_impl.super__Vector_impl_data._M_start[__new_size].cost_diff = (double)puVar1[2];
              uVar8 = *puVar1;
              dVar4 = (double)puVar1[1];
              pHVar2 = local_88.
                       super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                       ._M_impl.super__Vector_impl_data._M_start + __new_size;
              pHVar2->idx1 = (int)uVar8;
              pHVar2->idx2 = (int)((ulong)uVar8 >> 0x20);
              pHVar2->cost_combo = dVar4;
            }
            else {
              local_38 = (local_88.
                          super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                          ._M_impl.super__Vector_impl_data._M_start)->cost_diff;
              local_48._0_4_ =
                   (local_88.
                    super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                    ._M_impl.super__Vector_impl_data._M_start)->idx1;
              local_48._4_4_ =
                   (local_88.
                    super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                    ._M_impl.super__Vector_impl_data._M_start)->idx2;
              dStack_40 = (local_88.
                           super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                           ._M_impl.super__Vector_impl_data._M_start)->cost_combo;
              uVar8 = *puVar1;
              dVar4 = (double)puVar1[1];
              (local_88.
               super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>.
               _M_impl.super__Vector_impl_data._M_start)->idx1 = (int)uVar8;
              (local_88.
               super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>.
               _M_impl.super__Vector_impl_data._M_start)->idx2 = (int)((ulong)uVar8 >> 0x20);
              (local_88.
               super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>.
               _M_impl.super__Vector_impl_data._M_start)->cost_combo = dVar4;
              (local_88.
               super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>.
               _M_impl.super__Vector_impl_data._M_start)->cost_diff = (double)puVar1[2];
              local_88.
              super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>.
              _M_impl.super__Vector_impl_data._M_start[__new_size].cost_diff = local_38;
              pHVar2 = local_88.
                       super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                       ._M_impl.super__Vector_impl_data._M_start + __new_size;
              pHVar2->idx1 = (undefined4)local_48;
              pHVar2->idx2 = local_48._4_4_;
              pHVar2->cost_combo = dStack_40;
            }
            __new_size = __new_size + 1;
          }
          uVar11 = uVar11 + 1;
          lVar16 = lVar16 + 0x18;
        } while (uVar11 < (ulong)(((long)local_88.
                                         super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_88.
                                         super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555));
      }
      std::vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>::resize
                (&local_88,__new_size);
      if (local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar11 = 0;
        do {
          CompareAndPushToQueue<brotli::Histogram<704>>
                    (out,cluster_size,idx1,
                     local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar11],&local_88);
          uVar11 = uVar11 + 1;
        } while (uVar11 < (ulong)((long)local_a0.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_a0.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 2));
      }
    } while (local_70 <
             (ulong)((long)local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 2));
  }
LAB_00175af3:
  if (local_88.super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HistogramCombine(HistogramType* out,
                      uint32_t* cluster_size,
                      uint32_t* symbols,
                      size_t symbols_size,
                      size_t max_clusters) {
  double cost_diff_threshold = 0.0;
  size_t min_cluster_size = 1;

  // Uniquify the list of symbols.
  std::vector<uint32_t> clusters(symbols, symbols + symbols_size);
  std::sort(clusters.begin(), clusters.end());
  std::vector<uint32_t>::iterator last =
      std::unique(clusters.begin(), clusters.end());
  clusters.resize(static_cast<size_t>(last - clusters.begin()));

  // We maintain a heap of histogram pairs, ordered by the bit cost reduction.
  std::vector<HistogramPair> pairs;
  for (size_t idx1 = 0; idx1 < clusters.size(); ++idx1) {
    for (size_t idx2 = idx1 + 1; idx2 < clusters.size(); ++idx2) {
      CompareAndPushToQueue(out, cluster_size, clusters[idx1], clusters[idx2],
                            &pairs);
    }
  }

  while (clusters.size() > min_cluster_size) {
    if (pairs[0].cost_diff >= cost_diff_threshold) {
      cost_diff_threshold = 1e99;
      min_cluster_size = max_clusters;
      continue;
    }
    // Take the best pair from the top of heap.
    uint32_t best_idx1 = pairs[0].idx1;
    uint32_t best_idx2 = pairs[0].idx2;
    out[best_idx1].AddHistogram(out[best_idx2]);
    out[best_idx1].bit_cost_ = pairs[0].cost_combo;
    cluster_size[best_idx1] += cluster_size[best_idx2];
    for (size_t i = 0; i < symbols_size; ++i) {
      if (symbols[i] == best_idx2) {
        symbols[i] = best_idx1;
      }
    }
    for (std::vector<uint32_t>::iterator cluster = clusters.begin();
         cluster != clusters.end(); ++cluster) {
      if (*cluster >= best_idx2) {
        clusters.erase(cluster);
        break;
      }
    }

    // Remove pairs intersecting the just combined best pair.
    size_t copy_to_idx = 0;
    for (size_t i = 0; i < pairs.size(); ++i) {
      HistogramPair& p = pairs[i];
      if (p.idx1 == best_idx1 || p.idx2 == best_idx1 ||
          p.idx1 == best_idx2 || p.idx2 == best_idx2) {
        // Remove invalid pair from the queue.
        continue;
      }
      if (pairs.front() < p) {
        // Replace the top of the queue if needed.
        HistogramPair front = pairs.front();
        pairs.front() = p;
        pairs[copy_to_idx] = front;
      } else {
        pairs[copy_to_idx] = p;
      }
      ++copy_to_idx;
    }
    pairs.resize(copy_to_idx);

    // Push new pairs formed with the combined histogram to the heap.
    for (size_t i = 0; i < clusters.size(); ++i) {
      CompareAndPushToQueue(out, cluster_size, best_idx1, clusters[i], &pairs);
    }
  }
}